

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O1

void __thiscall
boost::deflate::deflate_stream_test::doDeflate2_beast
          (deflate_stream_test *this,ICompressor *c,int level,int windowBits,int memLevel,
          int strategy,string *check)

{
  ulong_long_type uVar1;
  runner *prVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  error_category *extraout_RDX;
  Bytef *pBVar6;
  int iVar7;
  bool bVar8;
  long lVar9;
  wrap wrap;
  error_code eVar10;
  string out;
  ulong local_a0;
  _func_int **local_98;
  Bytef *pBStack_90;
  undefined1 local_88;
  undefined7 uStack_87;
  string local_78;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  Bytef *local_48;
  ICompressor local_40;
  Bytef *pBStack_38;
  
  if (1 < check->_M_string_length) {
    local_a0 = 1;
    local_58 = level;
    local_54 = windowBits;
    local_50 = memLevel;
    local_4c = strategy;
    do {
      pBVar6 = (Bytef *)0x1;
      while( true ) {
        (*c->_vptr_ICompressor[1])
                  (c,(ulong)local_58,(ulong)local_54,(ulong)local_50,(ulong)local_4c);
        pBStack_90 = (Bytef *)0x0;
        local_88 = 0;
        local_98 = (_func_int **)&local_88;
        iVar4 = (*c->_vptr_ICompressor[0xb])(c,check->_M_string_length);
        std::__cxx11::string::resize((ulong)&local_98,(char)iVar4);
        if (pBStack_90 <= pBVar6) break;
        (*c->_vptr_ICompressor[5])(c,(check->_M_dataplus)._M_p);
        (*c->_vptr_ICompressor[3])(c,local_a0);
        (*c->_vptr_ICompressor[9])(c,local_98);
        local_48 = pBVar6;
        (*c->_vptr_ICompressor[7])(c,pBVar6);
        iVar4 = 0;
        bVar8 = false;
        do {
          iVar5 = (*c->_vptr_ICompressor[0xc])(c,(ulong)(uint)(iVar4 << 2));
          eVar10 = make_error_code(need_buffers);
          if (iVar5 == eVar10.val_) {
            uVar1 = (eVar10.cat_)->id_;
            wrap = extraout_RDX == eVar10.cat_;
            bVar3 = extraout_RDX->id_ == uVar1;
            if (uVar1 == 0) {
              bVar3 = (bool)wrap;
            }
            iVar7 = 10;
            if (!bVar3) goto LAB_00108f8c;
          }
          else {
LAB_00108f8c:
            eVar10 = make_error_code(end_of_stream);
            prVar2 = test_suite::detail::current()::p;
            if (iVar5 == eVar10.val_) {
              uVar1 = (eVar10.cat_)->id_;
              wrap = extraout_RDX == eVar10.cat_;
              bVar3 = extraout_RDX->id_ == uVar1;
              if (uVar1 == 0) {
                bVar3 = (bool)wrap;
              }
              iVar7 = 10;
              if (bVar3) goto LAB_0010909c;
            }
            (*extraout_RDX->_vptr_error_category[4])(&local_78,extraout_RDX,iVar5);
            wrap = 0x1f;
            bVar3 = test_suite::detail::runner::maybe_fail<bool>
                              (prVar2,(extraout_var & 1) == 0,"! ec",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
                               ,0x177,
                               "void boost::deflate::deflate_stream_test::doDeflate2_beast(ICompressor &, int, int, int, int, const std::string &)"
                               ,local_78._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            iVar7 = 0xb;
            if (bVar3) {
              iVar5 = (*c->_vptr_ICompressor[2])(c);
              if (CONCAT44(extraout_var_00,iVar5) == 0 && iVar4 == 0) {
                (*c->_vptr_ICompressor[3])(c,check->_M_string_length - local_a0);
                iVar4 = 1;
              }
              iVar5 = (*c->_vptr_ICompressor[6])(c);
              iVar7 = 0;
              if ((CONCAT44(extraout_var_01,iVar5) == 0) && (!bVar8)) {
                (*c->_vptr_ICompressor[7])(c,(long)pBStack_90 - (long)local_48);
                bVar8 = true;
              }
            }
          }
LAB_0010909c:
        } while (iVar7 == 0);
        if (iVar7 != 0xb) {
          iVar4 = (*c->_vptr_ICompressor[10])(c);
          std::__cxx11::string::resize((ulong)&local_98,(char)iVar4);
          prVar2 = test_suite::detail::current()::p;
          local_40._vptr_ICompressor = local_98;
          pBStack_38 = pBStack_90;
          decompress_abi_cxx11_
                    (&local_78,(deflate_stream_test *)&stack0xffffffffffffffc0,(string_view *)0x0,
                     wrap);
          if (local_78._M_string_length == check->_M_string_length) {
            lVar9 = 0x28;
            if (local_78._M_string_length != 0) {
              iVar4 = bcmp(local_78._M_dataplus._M_p,(check->_M_dataplus)._M_p,
                           local_78._M_string_length);
              if (iVar4 != 0) goto LAB_0010911c;
            }
          }
          else {
LAB_0010911c:
            lVar9 = 0x30;
          }
          (**(code **)((long)prVar2->_vptr_runner + lVar9))
                    (prVar2,"decompress(out) == check",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
                     ,0x187,
                     "void boost::deflate::deflate_stream_test::doDeflate2_beast(ICompressor &, int, int, int, int, const std::string &)"
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_98 != (_func_int **)&local_88) {
          operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
        }
        pBVar6 = local_48 + 1;
      }
      if (local_98 != (_func_int **)&local_88) {
        operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
      }
      local_a0 = local_a0 + 1;
    } while (local_a0 < check->_M_string_length);
  }
  return;
}

Assistant:

void doDeflate2_beast(
        ICompressor& c,
        int level, int windowBits, int memLevel,
        int strategy, std::string const& check)
    {
        for(std::size_t i = 1; i < check.size(); ++i)
        {
            for(std::size_t j = 1;; ++j)
            {
                c.init(
                    level,
                    windowBits,
                    memLevel,
                    strategy);
                std::string out;
                out.resize(c.bound(check.size()));
                if(j >= out.size())
                    break;
                c.next_in((void*)check.data());
                c.avail_in(i);
                c.next_out((void*)out.data());
                c.avail_out(j);
                bool bi = false;
                bool bo = false;
                for(;;)
                {
                    error_code ec = c.write(
                        bi ? Flush::full : Flush::none);
                    if( ec == error::need_buffers ||
                        ec == error::end_of_stream) // per zlib FAQ
                        goto fin;
                    if(! BOOST_TESTS(! ec, ec.message().c_str()))
                        goto err;
                    if(c.avail_in() == 0 && ! bi)
                    {
                        bi = true;
                        c.avail_in(check.size() - i);
                    }
                    if(c.avail_out() == 0 && ! bo)
                    {
                        bo = true;
                        c.avail_out(out.size() - j);
                    }
                }

            fin:
                out.resize(c.total_out());
                BOOST_TEST(decompress(out) == check);

            err:
                ;
            }
        }
    }